

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint64_t *puVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  array_container_t *paVar10;
  bitset_container_t *pbVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int32_t iVar16;
  uint32_t runValue;
  int iVar17;
  
  if (((src_1->n_runs == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    if ((bitset_container_t *)*dst == src_2) {
      return true;
    }
    pbVar11 = bitset_container_clone(src_2);
    *dst = pbVar11;
    return true;
  }
  uVar7 = croaring_hardware_support();
  if ((uVar7 & 2) == 0) {
    uVar7 = croaring_hardware_support();
    if ((uVar7 & 1) == 0) {
      iVar8 = src_1->n_runs;
      lVar13 = (long)iVar8;
      if (0 < lVar13) {
        lVar15 = 0;
        do {
          iVar8 = iVar8 + (uint)src_1->runs[lVar15].length;
          lVar15 = lVar15 + 1;
        } while (lVar13 != lVar15);
      }
    }
    else {
      iVar8 = _avx2_run_container_cardinality(src_1);
    }
  }
  else {
    iVar8 = _avx512_run_container_cardinality(src_1);
  }
  if (iVar8 < 0x1001) {
    iVar17 = src_2->cardinality;
    if (iVar8 < src_2->cardinality) {
      iVar17 = iVar8;
    }
    paVar10 = array_container_create_given_capacity(iVar17);
    *dst = paVar10;
    if ((paVar10 != (array_container_t *)0x0) && (iVar8 = src_1->n_runs, 0 < (long)iVar8)) {
      prVar3 = src_1->runs;
      puVar4 = paVar10->array;
      puVar5 = src_2->words;
      iVar16 = paVar10->cardinality;
      lVar13 = 0;
      do {
        uVar14 = (ulong)prVar3[lVar13].value;
        iVar17 = prVar3[lVar13].length + 1;
        do {
          puVar4[iVar16] = (uint16_t)uVar14;
          iVar16 = iVar16 + (uint)((*(ulong *)((long)puVar5 + (ulong)((uint)(uVar14 >> 3) & 0x1ff8))
                                    >> (uVar14 & 0x3f) & 1) != 0);
          uVar14 = (ulong)((int)uVar14 + 1);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar8);
      paVar10->cardinality = iVar16;
    }
  }
  else {
    pbVar11 = (bitset_container_t *)*dst;
    if (pbVar11 == src_2) {
      iVar8 = src_1->n_runs;
      if ((long)iVar8 < 1) {
        uVar7 = 0;
      }
      else {
        prVar3 = src_1->runs;
        puVar5 = src_2->words;
        lVar13 = 0;
        uVar7 = 0;
        do {
          uVar1 = prVar3[lVar13].value;
          uVar2 = prVar3[lVar13].length;
          if (uVar7 != uVar1) {
            uVar9 = uVar7 >> 6;
            uVar14 = -1L << ((byte)uVar7 & 0x3f);
            uVar7 = uVar1 - 1 >> 6;
            if (uVar7 - uVar9 == 0) {
              bVar12 = -(char)uVar1;
              uVar14 = (uVar14 << (bVar12 & 0x3f)) >> (bVar12 & 0x3f);
              uVar7 = uVar9;
            }
            else {
              puVar5[uVar9] = puVar5[uVar9] & ~uVar14;
              if (uVar9 + 1 < uVar7) {
                memset(puVar5 + (ulong)uVar9 + 1,0,(ulong)((uVar7 - uVar9) - 2) * 8 + 8);
              }
              uVar14 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar7] = puVar5[uVar7] & ~uVar14;
          }
          uVar7 = (uint)uVar1 + (uint)uVar2 + 1;
          lVar13 = lVar13 + 1;
        } while (iVar8 != lVar13);
      }
      if (uVar7 != 0x10000) {
        puVar5 = src_2->words;
        uVar9 = uVar7 >> 6;
        puVar5[uVar9] = puVar5[uVar9] & ~(-1L << ((byte)uVar7 & 0x3f));
        if (uVar9 != 0x3ff) {
          if (uVar7 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar7 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar9) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar8 = bitset_container_compute_cardinality(pbVar11);
      pbVar11->cardinality = iVar8;
      if (0x1000 < src_2->cardinality) {
        return 0x1000 < src_2->cardinality;
      }
      paVar10 = array_container_from_bitset(src_2);
      *dst = paVar10;
    }
    else {
      pbVar11 = bitset_container_clone(src_2);
      *dst = pbVar11;
      if (pbVar11 == (bitset_container_t *)0x0) {
        return true;
      }
      iVar8 = src_1->n_runs;
      if ((long)iVar8 < 1) {
        uVar7 = 0;
      }
      else {
        prVar3 = src_1->runs;
        puVar5 = pbVar11->words;
        lVar13 = 0;
        uVar7 = 0;
        do {
          uVar1 = prVar3[lVar13].value;
          uVar2 = prVar3[lVar13].length;
          if (uVar7 != uVar1) {
            uVar9 = uVar7 >> 6;
            uVar14 = -1L << ((byte)uVar7 & 0x3f);
            uVar7 = uVar1 - 1 >> 6;
            if (uVar7 - uVar9 == 0) {
              bVar12 = -(char)uVar1;
              uVar14 = (uVar14 << (bVar12 & 0x3f)) >> (bVar12 & 0x3f);
              uVar7 = uVar9;
            }
            else {
              puVar5[uVar9] = puVar5[uVar9] & ~uVar14;
              if (uVar9 + 1 < uVar7) {
                memset(puVar5 + (ulong)uVar9 + 1,0,(ulong)((uVar7 - uVar9) - 2) * 8 + 8);
              }
              uVar14 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar7] = puVar5[uVar7] & ~uVar14;
          }
          uVar7 = (uint)uVar2 + (uint)uVar1 + 1;
          lVar13 = lVar13 + 1;
        } while (iVar8 != lVar13);
      }
      if (uVar7 != 0x10000) {
        puVar5 = pbVar11->words;
        uVar9 = uVar7 >> 6;
        puVar5[uVar9] = puVar5[uVar9] & ~(-1L << ((byte)uVar7 & 0x3f));
        if (uVar9 != 0x3ff) {
          if (uVar7 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar7 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar9) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar8 = bitset_container_compute_cardinality(pbVar11);
      pbVar11->cardinality = iVar8;
      if (0x1000 < iVar8) {
        return 0x1000 < iVar8;
      }
      paVar10 = array_container_from_bitset(pbVar11);
      pvVar6 = *dst;
      if (pvVar6 != (void *)0x0) {
        (*global_memory_hook.aligned_free)(*(void **)((long)pvVar6 + 8));
        (*global_memory_hook.free)(pvVar6);
      }
      *dst = paVar10;
    }
  }
  return false;
}

Assistant:

bool run_bitset_container_intersection(const run_container_t *src_1,
                                       const bitset_container_t *src_2,
                                       container_t **dst) {
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}